

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O2

void __thiscall
TPZCreateApproximationSpace::BuildMesh
          (TPZCreateApproximationSpace *this,TPZCompMesh *cmesh,TPZVec<long> *gelindexes)

{
  int num_of_blocks;
  TPZGeoMesh *this_00;
  TPZGeoEl *pTVar1;
  TPZMaterial *pTVar2;
  TPZCompEl **ppTVar3;
  int64_t el;
  long lVar4;
  int64_t iVar5;
  int matid;
  TPZVec<TPZGeoEl_*> elvec;
  set<int,_std::less<int>,_std::allocator<int>_> matnotfound;
  int local_94;
  TPZCreateApproximationSpace *local_90;
  TPZChunkVector<TPZCompEl_*,_10> *local_88;
  TPZVec<TPZGeoEl_*> local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_90 = this;
  TPZVec<TPZGeoEl_*>::TPZVec(&local_80,gelindexes->fNElements);
  this_00 = cmesh->fReference;
  for (lVar4 = 0; lVar4 < gelindexes->fNElements; lVar4 = lVar4 + 1) {
    pTVar1 = TPZGeoMesh::Element(this_00,gelindexes->fStore[lVar4]);
    local_80.fStore[lVar4] = pTVar1;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  num_of_blocks = (int)(cmesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNElements;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (num_of_blocks < 0) {
    TPZBlock::SetNBlocks(&cmesh->fBlock,0);
  }
  TPZBlock::SetNBlocks(&cmesh->fBlock,num_of_blocks);
  local_88 = &(cmesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>;
  lVar4 = 0;
  iVar5 = local_80.fNElements;
  if (local_80.fNElements < 1) {
    iVar5 = lVar4;
  }
  for (; iVar5 != lVar4; lVar4 = lVar4 + 1) {
    pTVar1 = local_80.fStore[lVar4];
    if ((pTVar1 != (TPZGeoEl *)0x0) && (pTVar1->fReference == (TPZCompEl *)0x0)) {
      local_94 = pTVar1->fMatId;
      pTVar2 = TPZCompMesh::FindMaterial(cmesh,local_94);
      if (pTVar2 == (TPZMaterial *)0x0) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,&local_94);
      }
      else if ((pTVar1->fReference == (TPZCompEl *)0x0) && (pTVar1->fNumInterfaces == 0)) {
        CreateCompEl(local_90,pTVar1,cmesh);
        if (local_90->fCreateHybridMesh == true) {
          ppTVar3 = TPZChunkVector<TPZCompEl_*,_10>::operator[](local_88,(int64_t)pTVar1);
          pTVar1 = TPZCompEl::Reference(*ppTVar3);
          pTVar1->fReference = (TPZCompEl *)0x0;
        }
      }
    }
  }
  TPZCompMesh::InitializeBlock(cmesh);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  TPZVec<TPZGeoEl_*>::~TPZVec(&local_80);
  return;
}

Assistant:

void TPZCreateApproximationSpace::BuildMesh(TPZCompMesh &cmesh, const TPZVec<int64_t> &gelindexes) const {
    TPZVec<TPZGeoEl *> elvec(gelindexes.size());
    TPZGeoMesh *gmesh = cmesh.Reference();
    for(int64_t el = 0; el<gelindexes.size(); el++)
    {
        elvec[el] = gmesh->Element(gelindexes[el]);
    }
	int64_t i, nelem = elvec.NElements();
	int64_t neltocreate = 0;
	int64_t index;
	for(i=0; i<nelem; i++) {
		TPZGeoEl *gel = elvec[i];
		if(!gel) continue;
        if (gel->Reference()) {
            continue;
        }
	}
	std::set<int> matnotfound;
	int64_t nbl = cmesh.Block().NBlocks();
    if(neltocreate > nbl) 
    {
        cmesh.Block().SetNBlocks(neltocreate);
    }
    cmesh.Block().SetNBlocks(nbl);
	
	for(i=0; i<nelem; i++) {
		TPZGeoEl *gel = elvec[i];
		if(!gel || gel->Reference()) continue;
        int matid = gel->MaterialId();
        TPZMaterial * mat = cmesh.FindMaterial(matid);
        if(!mat)
        {
            matnotfound.insert(matid);
            continue;
        }
        
        if(!gel->Reference() && gel->NumInterfaces() == 0)
        {
            CreateCompEl(gel,cmesh);
            if (fCreateHybridMesh) {
                cmesh.ElementVec()[index]->Reference()->ResetReference();
            }
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {

                std::stringstream sout;
                if (index < 0) {
                    if(gel->Dimension() == 0){
                        sout << "Zero dimensional element, is your approximation space Hdiv?. " << std::endl;
                        gel->Print(sout);
                        sout << "No computational element was created. " << std::endl;
                    }
                }else{
                    cmesh.ElementVec()[index]->Print(sout);
                }
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
        }
	}
	cmesh.InitializeBlock();
}